

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Luna.cpp
# Opt level: O0

void ExecuteFile(char **argv,State *state)

{
  char *pcVar1;
  long in_RDI;
  OpenFileFail *exp;
  Exception *exp_1;
  string *in_stack_ffffffffffffff78;
  State *in_stack_ffffffffffffff80;
  allocator local_31;
  string local_30 [48];
  
  pcVar1 = *(char **)(in_RDI + 8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,pcVar1,&local_31);
  luna::State::DoModule(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  std::__cxx11::string::~string(local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  return;
}

Assistant:

void ExecuteFile(const char **argv, luna::State &state)
{
    try
    {
        state.DoModule(argv[1]);
    }
    catch (const luna::OpenFileFail &exp)
    {
        printf("%s: can not open file %s\n", argv[0], exp.What().c_str());
    }
    catch (const luna::Exception &exp)
    {
        printf("%s\n", exp.What().c_str());
    }
}